

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t zesGetPowerProcAddrTable(ze_api_version_t version,zes_power_dditable_t *pDdiTable)

{
  ze_result_t result;
  zes_power_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (zes_power_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (driver::context < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    pDdiTable->pfnGetProperties = driver::zesPowerGetProperties;
    pDdiTable->pfnGetEnergyCounter = driver::zesPowerGetEnergyCounter;
    pDdiTable->pfnGetLimits = driver::zesPowerGetLimits;
    pDdiTable->pfnSetLimits = driver::zesPowerSetLimits;
    pDdiTable->pfnGetEnergyThreshold = driver::zesPowerGetEnergyThreshold;
    pDdiTable->pfnSetEnergyThreshold = driver::zesPowerSetEnergyThreshold;
    pDdiTable->pfnGetLimitsExt = driver::zesPowerGetLimitsExt;
    pDdiTable->pfnSetLimitsExt = driver::zesPowerSetLimitsExt;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetPowerProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_power_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGetProperties                          = driver::zesPowerGetProperties;

    pDdiTable->pfnGetEnergyCounter                       = driver::zesPowerGetEnergyCounter;

    pDdiTable->pfnGetLimits                              = driver::zesPowerGetLimits;

    pDdiTable->pfnSetLimits                              = driver::zesPowerSetLimits;

    pDdiTable->pfnGetEnergyThreshold                     = driver::zesPowerGetEnergyThreshold;

    pDdiTable->pfnSetEnergyThreshold                     = driver::zesPowerSetEnergyThreshold;

    pDdiTable->pfnGetLimitsExt                           = driver::zesPowerGetLimitsExt;

    pDdiTable->pfnSetLimitsExt                           = driver::zesPowerSetLimitsExt;

    return result;
}